

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_28(QPDF *pdf,char *arg2)

{
  ostream *poVar1;
  QPDFObjectHandle QVar2;
  QPDFObjectHandle QVar3;
  allocator<char> local_89;
  undefined1 local_88 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  string local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  element_type local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  string local_48 [32];
  element_type local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  QPDF::getTrailer();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"/QTest",&local_89);
  QPDFObjectHandle::getKey(local_68);
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_28;
  QPDF::copyForeignObject(QVar2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  std::__cxx11::string::~string(local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
  poVar1 = std::operator<<((ostream *)&std::cout,"oops -- didn\'t throw");
  std::endl<char,std::char_traits<char>>(poVar1);
  QPDFObjectHandle::newInteger((longlong)local_88);
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_58;
  QPDF::copyForeignObject(QVar3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_80);
  poVar1 = std::operator<<((ostream *)&std::cout,"oops -- didn\'t throw");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

static void
test_28(QPDF& pdf, char const* arg2)
{
    // Copy foreign object errors
    try {
        pdf.copyForeignObject(pdf.getTrailer().getKey("/QTest"));
        std::cout << "oops -- didn't throw" << std::endl;
    } catch (std::logic_error const& e) {
        std::cout << "logic error: " << e.what() << std::endl;
    }
    try {
        pdf.copyForeignObject(QPDFObjectHandle::newInteger(1));
        std::cout << "oops -- didn't throw" << std::endl;
    } catch (std::logic_error const& e) {
        std::cout << "logic error: " << e.what() << std::endl;
    }
}